

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superenalotto.cpp
# Opt level: O2

int main(void)

{
  pointer piVar1;
  result_type rVar2;
  ostream *poVar3;
  long lVar4;
  int *j;
  pointer piVar5;
  int *piVar6;
  allocator_type local_13d9;
  vector<int,_std::allocator<int>_> gigi;
  mt19937 mt_rand;
  
  rVar2 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt_rand,rVar2);
  std::vector<int,_std::allocator<int>_>::vector(&gigi,6,&local_13d9);
  poVar3 = std::operator<<((ostream *)&std::cout,"Numeri Superenalotto");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (lVar4 = 0;
      piVar1 = gigi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish,
      piVar6 = gigi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start, lVar4 != 0x10; lVar4 = lVar4 + 4) {
    for (; piVar6 != piVar1; piVar6 = piVar6 + 1) {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&mt_rand);
      *piVar6 = (int)(rVar2 % 0x5a) + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (gigi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,gigi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    piVar1 = gigi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar5 = gigi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
      std::operator<<(poVar3," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&gigi.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main() {
    std::mt19937 mt_rand(time(0));
    std::vector<int> gigi(6);

    std::cout << "Numeri Superenalotto" << std::endl;

    for (auto i : {0,0,0,0})
    {
        std::generate (gigi.begin(), gigi.end(), [&mt_rand] { return (mt_rand() % 90) + 1; });
        std::sort (gigi.begin(), gigi.end());
        for (auto& j : gigi)
        {
            std::cout << j << " ";
        }
        std::cout << std::endl;
    }
}